

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O0

void __thiscall Solution::mutate_insertion(Solution *this)

{
  Vehicle *this_00;
  Vehicle *this_01;
  Point *p;
  int iVar1;
  size_type sVar2;
  reference ppVVar3;
  __shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *peVar4;
  mapped_type *pmVar5;
  int local_54;
  Solution *pSStack_50;
  int ec;
  int local_44;
  Point *pPStack_40;
  int original_position;
  Point *node;
  iterator nid;
  Vehicle *v2;
  Vehicle *v1;
  iterator vit;
  Solution *this_local;
  
  vit._M_node = (_List_node_base *)this;
  v1 = (Vehicle *)std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&this->vehicles);
  iVar1 = rand();
  sVar2 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::size(&this->vehicles);
  std::advance<std::_List_iterator<Vehicle*>,unsigned_long>
            ((_List_iterator<Vehicle_*> *)&v1,(ulong)(long)iVar1 % sVar2);
  ppVVar3 = std::_List_iterator<Vehicle_*>::operator*((_List_iterator<Vehicle_*> *)&v1);
  this_00 = *ppVVar3;
  sVar2 = std::__cxx11::
          list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::size
                    (&this_00->nodes);
  if (sVar2 != 1) {
    nid._M_node = (_List_node_base *)
                  std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&this->vehicles);
    v1 = (Vehicle *)nid._M_node;
    iVar1 = rand();
    sVar2 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::size(&this->vehicles);
    std::advance<std::_List_iterator<Vehicle*>,unsigned_long>
              ((_List_iterator<Vehicle_*> *)&v1,(ulong)(long)iVar1 % sVar2);
    ppVVar3 = std::_List_iterator<Vehicle_*>::operator*((_List_iterator<Vehicle_*> *)&v1);
    this_01 = *ppVVar3;
    node = (Point *)std::__cxx11::
                    list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                    ::begin(&this_00->nodes);
    iVar1 = rand();
    sVar2 = std::__cxx11::
            list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
            size(&this_00->nodes);
    std::advance<std::_List_iterator<std::shared_ptr<VehicleState>>,unsigned_long>
              ((_List_iterator<std::shared_ptr<VehicleState>_> *)&node,(ulong)(long)iVar1 % sVar2);
    this_02 = (__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::_List_iterator<std::shared_ptr<VehicleState>_>::operator*
                        ((_List_iterator<std::shared_ptr<VehicleState>_> *)&node);
    peVar4 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_02);
    pPStack_40 = peVar4->p;
    pSStack_50 = this;
    pmVar5 = std::
             unordered_map<Solution_*,_std::pair<Vehicle_*,_int>,_std::hash<Solution_*>,_std::equal_to<Solution_*>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>_>
             ::operator[](&pPStack_40->state,&stack0xffffffffffffffb0);
    local_44 = pmVar5->second;
    Vehicle::remove_node(this_00,local_44);
    p = pPStack_40;
    local_54 = 0;
    iVar1 = rand();
    sVar2 = std::__cxx11::
            list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
            size(&this_01->nodes);
    Vehicle::add_node(this_01,p,(int)((ulong)(long)iVar1 % sVar2),&local_54);
    if (local_54 != 0) {
      local_54 = 0;
      Vehicle::add_node(this_00,pPStack_40,local_44,&local_54);
    }
  }
  return;
}

Assistant:

void Solution::mutate_insertion() {
    auto vit = vehicles.begin();
    Vehicle *v1;
    Vehicle *v2;
    std::advance(vit, rand() % vehicles.size());
    v1 = *vit;

    if (v1->nodes.size() == 1)
        return;

    vit = vehicles.begin();
    std::advance(vit, rand() % vehicles.size());
    v2 = *vit;

    auto nid = v1->nodes.begin();
    std::advance(nid, rand() % v1->nodes.size());
    auto node = (*nid)->p;
    auto original_position = node->state[this].second;

    v1->remove_node(original_position);
    //tries to insert at a random position
    auto ec = 0;
    v2->add_node(node, rand() % v2->nodes.size(), ec);
    if (ec != 0)//Error
    {
        ec = 0;
        v1->add_node(node, original_position, ec);
    }
}